

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O0

void av1_highbd_convolve_x_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i alVar30;
  __m128i alVar31;
  __m128i alVar32;
  __m128i alVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ushort uVar44;
  int iVar45;
  ushort uVar49;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ushort uVar48;
  ushort uVar51;
  undefined8 extraout_XMM0_Qa_01;
  int iVar50;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar52;
  int iVar53;
  ushort uVar55;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ushort uVar54;
  ushort uVar57;
  undefined8 extraout_XMM0_Qb_01;
  int iVar56;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long in_stack_00000008;
  long in_stack_00000018;
  int in_stack_00000020;
  __m128i res_1;
  __m128i res_odd1_1;
  __m128i res_even1_1;
  __m128i res_odd_1;
  __m128i res_even_1;
  __m128i row01_1;
  __m128i row00_1;
  __m128i coeffs_x_1 [4];
  __m128i s_1 [4];
  __m128i res;
  __m128i res_odd1;
  __m128i res_even1;
  __m128i res_odd;
  __m128i res_even;
  __m128i row02;
  __m128i row01;
  __m128i row00;
  __m128i coeffs_x [6];
  __m128i s [6];
  __m128i zero;
  __m128i clip_pixel;
  __m128i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  __m128i round_shift_x;
  __m128i round_const_x;
  uint16_t *src_ptr;
  int fo_horiz;
  int j;
  int i;
  __m128i *in_stack_fffffffffffff808;
  __m128i *in_stack_fffffffffffff818;
  __m128i *coeffs;
  __m128i *in_stack_fffffffffffff820;
  InterpFilterParams *in_stack_fffffffffffff828;
  undefined2 in_stack_fffffffffffff830;
  undefined4 uVar58;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  longlong local_758 [8];
  __m128i local_718;
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  ushort local_6d8;
  ushort uStack_6d6;
  ushort uStack_6d4;
  ushort uStack_6d2;
  ushort uStack_6d0;
  ushort uStack_6ce;
  ushort uStack_6cc;
  ushort uStack_6ca;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  uint local_54c;
  ulong local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  long local_520;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  long local_500;
  int local_4f4;
  undefined1 local_4e8 [16];
  uint local_4cc;
  undefined1 local_4c8 [16];
  uint local_4b8;
  int local_4b4;
  int local_4b0;
  undefined2 local_4aa;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined1 (*local_490) [16];
  __m128i *local_488;
  undefined1 (*local_480) [16];
  undefined1 (*local_478) [16];
  undefined1 (*local_470) [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  ulong local_408;
  undefined8 uStack_400;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  ulong local_3e8;
  undefined8 uStack_3e0;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  ulong local_3c8;
  undefined8 uStack_3c0;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  ulong local_3a8;
  undefined8 uStack_3a0;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  ulong local_388;
  undefined8 uStack_380;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  ulong local_368;
  undefined8 uStack_360;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  ulong local_348;
  undefined8 uStack_340;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_518 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_520 = in_RDI + (long)local_518 * -2;
  local_4b0 = (1 << (*(byte *)(in_stack_00000018 + 0x14) & 0x1f)) >> 1;
  local_538 = CONCAT44(local_4b0,local_4b0);
  uStack_530 = CONCAT44(local_4b0,local_4b0);
  local_4b8 = *(uint *)(in_stack_00000018 + 0x14);
  local_4c8._4_4_ = 0;
  local_4c8._0_4_ = local_4b8;
  local_548 = local_4c8._0_8_;
  uStack_540 = 0;
  local_54c = 7 - *(int *)(in_stack_00000018 + 0x14);
  local_4e8._4_4_ = 0;
  local_4e8._0_4_ = local_54c;
  local_568 = local_4e8._0_8_;
  uStack_560 = 0;
  local_4b4 = (1 << ((byte)local_54c & 0x1f)) >> 1;
  local_578 = CONCAT44(local_4b4,local_4b4);
  uStack_570 = CONCAT44(local_4b4,local_4b4);
  if (in_stack_00000020 == 10) {
    uVar58 = 0x3ff;
  }
  else {
    uVar58 = 0xff;
    if (in_stack_00000020 == 0xc) {
      uVar58 = 0xfff;
    }
  }
  local_4aa = (undefined2)uVar58;
  local_588 = CONCAT26(local_4aa,CONCAT24(local_4aa,CONCAT22(local_4aa,local_4aa)));
  uStack_580 = CONCAT26(local_4aa,CONCAT24(local_4aa,CONCAT22(local_4aa,local_4aa)));
  local_4a8 = 0;
  uStack_4a0 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_50c = in_R9D;
  local_508 = in_R8D;
  local_504 = in_ECX;
  local_500 = in_RDX;
  local_4f4 = in_ESI;
  local_4e8 = ZEXT416(local_54c);
  local_4cc = local_54c;
  local_4c8 = ZEXT416(local_4b8);
  local_68 = local_538;
  uStack_60 = uStack_530;
  local_58 = local_4b0;
  local_54 = local_4b0;
  local_50 = local_4b0;
  local_4c = local_4b0;
  local_48 = local_578;
  uStack_40 = uStack_570;
  local_38 = local_4b4;
  local_34 = local_4b4;
  local_30 = local_4b4;
  local_2c = local_4b4;
  local_28 = local_588;
  uStack_20 = uStack_580;
  local_10 = local_4aa;
  local_e = local_4aa;
  local_c = local_4aa;
  local_a = local_4aa;
  local_8 = local_4aa;
  local_6 = local_4aa;
  local_4 = local_4aa;
  local_2 = local_4aa;
  if (*(short *)(in_stack_00000008 + 8) == 0xc) {
    prepare_coeffs_12tap
              ((InterpFilterParams *)CONCAT44(uVar58,CONCAT22(local_4aa,in_stack_fffffffffffff830)),
               (int)((ulong)in_stack_fffffffffffff828 >> 0x20),in_stack_fffffffffffff820);
    for (local_514 = 0; local_514 < local_508; local_514 = local_514 + 8) {
      for (local_510 = 0; local_510 < local_50c; local_510 = local_510 + 1) {
        local_470 = (undefined1 (*) [16])(local_520 + (long)(local_510 * local_4f4 + local_514) * 2)
        ;
        local_668 = *(undefined8 *)*local_470;
        uStack_660 = *(undefined8 *)(*local_470 + 8);
        local_5f8 = *local_470;
        local_478 = (undefined1 (*) [16])
                    (local_520 + (long)(local_514 + 8 + local_510 * local_4f4) * 2);
        local_678 = *(undefined8 *)*local_478;
        uStack_670 = *(undefined8 *)(*local_478 + 8);
        local_5b8 = *local_478;
        local_480 = (undefined1 (*) [16])
                    (local_520 + (long)(local_514 + 0x10 + local_510 * local_4f4) * 2);
        local_688 = *(undefined8 *)*local_480;
        uStack_680 = *(undefined8 *)(*local_480 + 8);
        auVar1._16_16_ = *local_478;
        auVar1._0_16_ = *local_470;
        local_5e8 = auVar1._4_16_;
        local_5d8._8_8_ = uStack_660;
        auVar2._16_16_ = *local_478;
        auVar2._0_16_ = *local_470;
        local_5c8 = auVar2._12_16_;
        auVar3._16_16_ = *local_480;
        auVar3._0_16_ = *local_478;
        local_5a8 = auVar3._4_16_;
        convolve_12tap(in_stack_fffffffffffff808,(__m128i *)0x50eeb5);
        local_248 = local_538;
        uVar36 = local_248;
        uStack_240 = uStack_530;
        uVar37 = uStack_240;
        local_238 = (int)extraout_XMM0_Qa;
        iStack_234 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_230 = (int)extraout_XMM0_Qb;
        iStack_22c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_248._0_4_ = (int)local_538;
        local_248._4_4_ = (int)((ulong)local_538 >> 0x20);
        uStack_240._0_4_ = (int)uStack_530;
        uStack_240._4_4_ = (int)((ulong)uStack_530 >> 0x20);
        local_338 = local_238 + (int)local_248;
        iStack_334 = iStack_234 + local_248._4_4_;
        iStack_330 = iStack_230 + (int)uStack_240;
        iStack_32c = iStack_22c + uStack_240._4_4_;
        local_348 = local_548;
        uStack_340 = uStack_540;
        auVar21._8_8_ = uStack_540;
        auVar21._0_8_ = local_548;
        local_698 = CONCAT44(iStack_334 >> auVar21,local_338 >> auVar21);
        uStack_690 = CONCAT44(iStack_32c >> auVar21,iStack_330 >> auVar21);
        local_258 = local_698;
        uStack_250 = uStack_690;
        local_268 = local_578;
        uVar34 = local_268;
        uStack_260 = uStack_570;
        uVar35 = uStack_260;
        local_268._0_4_ = (int)local_578;
        local_268._4_4_ = (int)((ulong)local_578 >> 0x20);
        uStack_260._0_4_ = (int)uStack_570;
        uStack_260._4_4_ = (int)((ulong)uStack_570 >> 0x20);
        local_358 = (local_338 >> auVar21) + (int)local_268;
        iStack_354 = (iStack_334 >> auVar21) + local_268._4_4_;
        iStack_350 = (iStack_330 >> auVar21) + (int)uStack_260;
        iStack_34c = (iStack_32c >> auVar21) + uStack_260._4_4_;
        local_368 = local_568;
        uStack_360 = uStack_560;
        auVar20._8_8_ = uStack_560;
        auVar20._0_8_ = local_568;
        local_698 = CONCAT44(iStack_354 >> auVar20,local_358 >> auVar20);
        uStack_690 = CONCAT44(iStack_34c >> auVar20,iStack_350 >> auVar20);
        auVar4._24_8_ = uStack_670;
        auVar4._16_8_ = local_678;
        auVar4._8_8_ = uStack_660;
        auVar4._0_8_ = local_668;
        local_5f8 = auVar4._2_16_;
        auVar5._24_8_ = uStack_670;
        auVar5._16_8_ = local_678;
        auVar5._8_8_ = uStack_660;
        auVar5._0_8_ = local_668;
        local_5e8 = auVar5._6_16_;
        auVar6._24_8_ = uStack_670;
        auVar6._16_8_ = local_678;
        auVar6._8_8_ = uStack_660;
        auVar6._0_8_ = local_668;
        local_5d8 = auVar6._10_16_;
        auVar7._24_8_ = uStack_670;
        auVar7._16_8_ = local_678;
        auVar7._8_8_ = uStack_660;
        auVar7._0_8_ = local_668;
        local_5c8 = auVar7._14_16_;
        auVar8._24_8_ = uStack_680;
        auVar8._16_8_ = local_688;
        auVar8._8_8_ = uStack_670;
        auVar8._0_8_ = local_678;
        local_5b8 = auVar8._2_16_;
        auVar9._24_8_ = uStack_680;
        auVar9._16_8_ = local_688;
        auVar9._8_8_ = uStack_670;
        auVar9._0_8_ = local_678;
        local_5a8 = auVar9._6_16_;
        local_268 = uVar34;
        uStack_260 = uVar35;
        local_248 = uVar36;
        uStack_240 = uVar37;
        convolve_12tap(in_stack_fffffffffffff808,(__m128i *)0x50f050);
        local_288 = local_538;
        uVar38 = local_288;
        uStack_280 = uStack_530;
        uVar39 = uStack_280;
        local_278 = (int)extraout_XMM0_Qa_00;
        iStack_274 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        iStack_270 = (int)extraout_XMM0_Qb_00;
        iStack_26c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        local_288._0_4_ = (int)local_538;
        local_288._4_4_ = (int)((ulong)local_538 >> 0x20);
        uStack_280._0_4_ = (int)uStack_530;
        uStack_280._4_4_ = (int)((ulong)uStack_530 >> 0x20);
        local_378 = local_278 + (int)local_288;
        iStack_374 = iStack_274 + local_288._4_4_;
        iStack_370 = iStack_270 + (int)uStack_280;
        iStack_36c = iStack_26c + uStack_280._4_4_;
        local_388 = local_548;
        uStack_380 = uStack_540;
        auVar19._8_8_ = uStack_540;
        auVar19._0_8_ = local_548;
        local_6a8 = CONCAT44(iStack_374 >> auVar19,local_378 >> auVar19);
        uStack_6a0 = CONCAT44(iStack_36c >> auVar19,iStack_370 >> auVar19);
        local_298 = local_6a8;
        uStack_290 = uStack_6a0;
        local_2a8 = local_578;
        uVar36 = local_2a8;
        uStack_2a0 = uStack_570;
        uVar37 = uStack_2a0;
        local_2a8._0_4_ = (int)local_578;
        local_2a8._4_4_ = (int)((ulong)local_578 >> 0x20);
        uStack_2a0._0_4_ = (int)uStack_570;
        uStack_2a0._4_4_ = (int)((ulong)uStack_570 >> 0x20);
        local_398 = (local_378 >> auVar19) + (int)local_2a8;
        iStack_394 = (iStack_374 >> auVar19) + local_2a8._4_4_;
        iStack_390 = (iStack_370 >> auVar19) + (int)uStack_2a0;
        iStack_38c = (iStack_36c >> auVar19) + uStack_2a0._4_4_;
        local_3a8 = local_568;
        uStack_3a0 = uStack_560;
        auVar18._8_8_ = uStack_560;
        auVar18._0_8_ = local_568;
        local_6a8 = CONCAT44(iStack_394 >> auVar18,local_398 >> auVar18);
        uStack_6a0 = CONCAT44(iStack_38c >> auVar18,iStack_390 >> auVar18);
        local_1b8 = local_698;
        uStack_1b0 = uStack_690;
        local_1c8 = local_698;
        uStack_1c0 = uStack_690;
        auVar29._8_8_ = uStack_690;
        auVar29._0_8_ = local_698;
        auVar28._8_8_ = uStack_690;
        auVar28._0_8_ = local_698;
        local_6b8 = packssdw(auVar29,auVar28);
        local_1d8 = local_6a8;
        uStack_1d0 = uStack_6a0;
        local_1e8 = local_6a8;
        uStack_1e0 = uStack_6a0;
        auVar27._8_8_ = uStack_6a0;
        auVar27._0_8_ = local_6a8;
        auVar26._8_8_ = uStack_6a0;
        auVar26._0_8_ = local_6a8;
        local_6c8 = packssdw(auVar27,auVar26);
        local_438 = local_6b8._0_8_;
        uVar35 = local_438;
        uStack_430 = local_6b8._8_8_;
        local_448 = local_6c8._0_8_;
        uVar34 = local_448;
        uStack_440 = local_6c8._8_8_;
        local_438._0_2_ = local_6b8._0_2_;
        local_438._2_2_ = local_6b8._2_2_;
        local_438._4_2_ = local_6b8._4_2_;
        local_438._6_2_ = local_6b8._6_2_;
        local_448._0_2_ = local_6c8._0_2_;
        local_448._2_2_ = local_6c8._2_2_;
        local_448._4_2_ = local_6c8._4_2_;
        local_448._6_2_ = local_6c8._6_2_;
        local_178 = CONCAT26(local_448._2_2_,
                             CONCAT24(local_438._2_2_,CONCAT22((short)local_448,(short)local_438)));
        uStack_170 = CONCAT26(local_448._6_2_,
                              CONCAT24(local_438._6_2_,CONCAT22(local_448._4_2_,local_438._4_2_)));
        local_188 = local_588;
        uVar40 = local_188;
        uStack_180 = uStack_580;
        uVar41 = uStack_180;
        local_188._0_2_ = (short)local_588;
        local_188._2_2_ = (short)((ulong)local_588 >> 0x10);
        local_188._4_2_ = (short)((ulong)local_588 >> 0x20);
        local_188._6_2_ = (short)((ulong)local_588 >> 0x30);
        uStack_180._0_2_ = (short)uStack_580;
        uStack_180._2_2_ = (short)((ulong)uStack_580 >> 0x10);
        uStack_180._4_2_ = (short)((ulong)uStack_580 >> 0x20);
        uStack_180._6_2_ = (short)((ulong)uStack_580 >> 0x30);
        uVar44 = (ushort)((short)local_188 < (short)local_438) * (short)local_188 |
                 (ushort)((short)local_188 >= (short)local_438) * (short)local_438;
        uVar48 = (ushort)(local_188._2_2_ < (short)local_448) * local_188._2_2_ |
                 (ushort)(local_188._2_2_ >= (short)local_448) * (short)local_448;
        uVar49 = (ushort)(local_188._4_2_ < local_438._2_2_) * local_188._4_2_ |
                 (ushort)(local_188._4_2_ >= local_438._2_2_) * local_438._2_2_;
        uVar51 = (ushort)(local_188._6_2_ < local_448._2_2_) * local_188._6_2_ |
                 (ushort)(local_188._6_2_ >= local_448._2_2_) * local_448._2_2_;
        uVar52 = (ushort)((short)uStack_180 < local_438._4_2_) * (short)uStack_180 |
                 (ushort)((short)uStack_180 >= local_438._4_2_) * local_438._4_2_;
        uVar54 = (ushort)(uStack_180._2_2_ < local_448._4_2_) * uStack_180._2_2_ |
                 (ushort)(uStack_180._2_2_ >= local_448._4_2_) * local_448._4_2_;
        uVar55 = (ushort)(uStack_180._4_2_ < local_438._6_2_) * uStack_180._4_2_ |
                 (ushort)(uStack_180._4_2_ >= local_438._6_2_) * local_438._6_2_;
        uVar57 = (ushort)(uStack_180._6_2_ < local_448._6_2_) * uStack_180._6_2_ |
                 (ushort)(uStack_180._6_2_ >= local_448._6_2_) * local_448._6_2_;
        local_138 = CONCAT26(uVar51,CONCAT24(uVar49,CONCAT22(uVar48,uVar44)));
        uStack_130 = CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22(uVar54,uVar52)));
        local_148 = local_598;
        uVar42 = local_148;
        uStack_140 = uStack_590;
        uVar43 = uStack_140;
        local_148._0_2_ = (short)local_598;
        local_148._2_2_ = (short)((ulong)local_598 >> 0x10);
        local_148._4_2_ = (short)((ulong)local_598 >> 0x20);
        local_148._6_2_ = (short)((ulong)local_598 >> 0x30);
        uStack_140._0_2_ = (short)uStack_590;
        uStack_140._2_2_ = (short)((ulong)uStack_590 >> 0x10);
        uStack_140._4_2_ = (short)((ulong)uStack_590 >> 0x20);
        uStack_140._6_2_ = (short)((ulong)uStack_590 >> 0x30);
        local_6d8 = (ushort)((short)uVar44 < (short)local_148) * (short)local_148 |
                    ((short)uVar44 >= (short)local_148) * uVar44;
        uStack_6d6 = (ushort)((short)uVar48 < local_148._2_2_) * local_148._2_2_ |
                     ((short)uVar48 >= local_148._2_2_) * uVar48;
        uStack_6d4 = (ushort)((short)uVar49 < local_148._4_2_) * local_148._4_2_ |
                     ((short)uVar49 >= local_148._4_2_) * uVar49;
        uStack_6d2 = (ushort)((short)uVar51 < local_148._6_2_) * local_148._6_2_ |
                     ((short)uVar51 >= local_148._6_2_) * uVar51;
        uStack_6d0 = (ushort)((short)uVar52 < (short)uStack_140) * (short)uStack_140 |
                     ((short)uVar52 >= (short)uStack_140) * uVar52;
        uStack_6ce = (ushort)((short)uVar54 < uStack_140._2_2_) * uStack_140._2_2_ |
                     ((short)uVar54 >= uStack_140._2_2_) * uVar54;
        uStack_6cc = (ushort)((short)uVar55 < uStack_140._4_2_) * uStack_140._4_2_ |
                     ((short)uVar55 >= uStack_140._4_2_) * uVar55;
        uStack_6ca = (ushort)((short)uVar57 < uStack_140._6_2_) * uStack_140._6_2_ |
                     ((short)uVar57 >= uStack_140._6_2_) * uVar57;
        if (local_508 - local_514 < 5) {
          if (local_508 == 4) {
            local_b0 = (undefined8 *)(local_500 + (long)(local_510 * local_504 + local_514) * 2);
            local_c8 = CONCAT26(uStack_6d2,CONCAT24(uStack_6d4,CONCAT22(uStack_6d6,local_6d8)));
            uStack_c0 = CONCAT26(uStack_6ca,CONCAT24(uStack_6cc,CONCAT22(uStack_6ce,uStack_6d0)));
            *local_b0 = local_c8;
          }
          else {
            local_88 = CONCAT26(uStack_6d2,CONCAT24(uStack_6d4,CONCAT22(uStack_6d6,local_6d8)));
            uStack_80 = CONCAT26(uStack_6ca,CONCAT24(uStack_6cc,CONCAT22(uStack_6ce,uStack_6d0)));
            *(uint *)(local_500 + (long)(local_510 * local_504 + local_514) * 2) =
                 CONCAT22(uStack_6d6,local_6d8);
            local_78 = local_88;
            uStack_70 = uStack_80;
          }
        }
        else {
          local_f0 = (undefined8 *)(local_500 + (long)(local_510 * local_504 + local_514) * 2);
          local_108 = CONCAT26(uStack_6d2,CONCAT24(uStack_6d4,CONCAT22(uStack_6d6,local_6d8)));
          uStack_100 = CONCAT26(uStack_6ca,CONCAT24(uStack_6cc,CONCAT22(uStack_6ce,uStack_6d0)));
          *local_f0 = local_108;
          local_f0[1] = uStack_100;
        }
        local_448 = uVar34;
        local_438 = uVar35;
        local_2a8 = uVar36;
        uStack_2a0 = uVar37;
        local_288 = uVar38;
        uStack_280 = uVar39;
        local_188 = uVar40;
        uStack_180 = uVar41;
        local_148 = uVar42;
        uStack_140 = uVar43;
      }
    }
  }
  else {
    prepare_coeffs(in_stack_fffffffffffff828,(int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                   in_stack_fffffffffffff818);
    for (local_514 = 0; local_514 < local_508; local_514 = local_514 + 8) {
      for (local_510 = 0; local_510 < local_50c; local_510 = local_510 + 1) {
        local_488 = (__m128i *)(local_520 + (long)(local_510 * local_4f4 + local_514) * 2);
        alVar33 = *local_488;
        alVar32 = *local_488;
        alVar31 = *local_488;
        alVar30 = *local_488;
        local_718 = *local_488;
        local_490 = (undefined1 (*) [16])
                    (local_520 + (long)(local_514 + 8 + local_510 * local_4f4) * 2);
        auVar22 = *local_490;
        auVar16 = *local_490;
        auVar47 = *local_490;
        auVar46 = *local_490;
        auVar10._16_16_ = *local_490;
        auVar10._0_16_ = (undefined1  [16])*local_488;
        local_708 = auVar10._4_16_;
        local_6f8._8_8_ = (*local_488)[1];
        auVar11._16_16_ = *local_490;
        auVar11._0_16_ = (undefined1  [16])*local_488;
        local_6e8 = auVar11._12_16_;
        coeffs = (__m128i *)local_758;
        convolve(&local_718,coeffs);
        local_2c8 = local_538;
        uVar34 = local_2c8;
        uStack_2c0 = uStack_530;
        uVar35 = uStack_2c0;
        local_2b8 = (int)extraout_XMM0_Qa_01;
        iStack_2b4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        iStack_2b0 = (int)extraout_XMM0_Qb_01;
        iStack_2ac = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        local_2c8._0_4_ = (int)local_538;
        local_2c8._4_4_ = (int)((ulong)local_538 >> 0x20);
        uStack_2c0._0_4_ = (int)uStack_530;
        uStack_2c0._4_4_ = (int)((ulong)uStack_530 >> 0x20);
        local_3b8 = local_2b8 + (int)local_2c8;
        iStack_3b4 = iStack_2b4 + local_2c8._4_4_;
        iStack_3b0 = iStack_2b0 + (int)uStack_2c0;
        iStack_3ac = iStack_2ac + uStack_2c0._4_4_;
        local_3c8 = local_548;
        uStack_3c0 = uStack_540;
        auVar17._8_8_ = uStack_540;
        auVar17._0_8_ = local_548;
        iVar45 = local_3b8 >> auVar17;
        iVar50 = iStack_3b4 >> auVar17;
        iVar53 = iStack_3b0 >> auVar17;
        iVar56 = iStack_3ac >> auVar17;
        local_788 = CONCAT44(iVar50,iVar45);
        uStack_780 = CONCAT44(iVar56,iVar53);
        auVar12._16_16_ = auVar46;
        auVar12._0_16_ = (undefined1  [16])alVar30;
        local_718 = auVar12._2_16_;
        auVar13._16_16_ = auVar47;
        auVar13._0_16_ = (undefined1  [16])alVar31;
        local_708 = auVar13._6_16_;
        auVar14._16_16_ = auVar16;
        auVar14._0_16_ = (undefined1  [16])alVar32;
        local_6f8 = auVar14._10_16_;
        auVar15._16_16_ = auVar22;
        auVar15._0_16_ = (undefined1  [16])alVar33;
        local_6e8 = auVar15._14_16_;
        local_2c8 = uVar34;
        uStack_2c0 = uVar35;
        convolve(&local_718,coeffs);
        local_2e8 = local_538;
        uVar38 = local_2e8;
        uStack_2e0 = uStack_530;
        uVar39 = uStack_2e0;
        local_2d8 = (int)extraout_XMM0_Qa_02;
        iStack_2d4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
        iStack_2d0 = (int)extraout_XMM0_Qb_02;
        iStack_2cc = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        local_2e8._0_4_ = (int)local_538;
        local_2e8._4_4_ = (int)((ulong)local_538 >> 0x20);
        uStack_2e0._0_4_ = (int)uStack_530;
        uStack_2e0._4_4_ = (int)((ulong)uStack_530 >> 0x20);
        local_3d8 = local_2d8 + (int)local_2e8;
        iStack_3d4 = iStack_2d4 + local_2e8._4_4_;
        iStack_3d0 = iStack_2d0 + (int)uStack_2e0;
        iStack_3cc = iStack_2cc + uStack_2e0._4_4_;
        local_3e8 = local_548;
        uStack_3e0 = uStack_540;
        auVar16._8_8_ = uStack_540;
        auVar16._0_8_ = local_548;
        local_798 = CONCAT44(iStack_3d4 >> auVar16,local_3d8 >> auVar16);
        uStack_790 = CONCAT44(iStack_3cc >> auVar16,iStack_3d0 >> auVar16);
        local_2f8 = local_788;
        uStack_2f0 = uStack_780;
        local_308 = local_578;
        uVar36 = local_308;
        uStack_300 = uStack_570;
        uVar37 = uStack_300;
        local_308._0_4_ = (int)local_578;
        local_308._4_4_ = (int)((ulong)local_578 >> 0x20);
        uStack_300._0_4_ = (int)uStack_570;
        uStack_300._4_4_ = (int)((ulong)uStack_570 >> 0x20);
        local_3f8 = iVar45 + (int)local_308;
        iStack_3f4 = iVar50 + local_308._4_4_;
        iStack_3f0 = iVar53 + (int)uStack_300;
        iStack_3ec = iVar56 + uStack_300._4_4_;
        local_408 = local_568;
        uStack_400 = uStack_560;
        auVar47._8_8_ = uStack_560;
        auVar47._0_8_ = local_568;
        local_788 = CONCAT44(iStack_3f4 >> auVar47,local_3f8 >> auVar47);
        uStack_780 = CONCAT44(iStack_3ec >> auVar47,iStack_3f0 >> auVar47);
        local_318 = local_798;
        uStack_310 = uStack_790;
        local_328 = local_578;
        uStack_320 = uStack_570;
        local_418 = (local_3d8 >> auVar16) + (int)local_308;
        iStack_414 = (iStack_3d4 >> auVar16) + local_308._4_4_;
        iStack_410 = (iStack_3d0 >> auVar16) + (int)uStack_300;
        iStack_40c = (iStack_3cc >> auVar16) + uStack_300._4_4_;
        local_428 = local_568;
        uStack_420 = uStack_560;
        auVar46._8_8_ = uStack_560;
        auVar46._0_8_ = local_568;
        local_798 = CONCAT44(iStack_414 >> auVar46,local_418 >> auVar46);
        uStack_790 = CONCAT44(iStack_40c >> auVar46,iStack_410 >> auVar46);
        local_1f8 = local_788;
        uStack_1f0 = uStack_780;
        local_208 = local_788;
        uStack_200 = uStack_780;
        auVar25._8_8_ = uStack_780;
        auVar25._0_8_ = local_788;
        auVar24._8_8_ = uStack_780;
        auVar24._0_8_ = local_788;
        auVar46 = packssdw(auVar25,auVar24);
        local_218 = local_798;
        uStack_210 = uStack_790;
        local_228 = local_798;
        uStack_220 = uStack_790;
        auVar23._8_8_ = uStack_790;
        auVar23._0_8_ = local_798;
        auVar22._8_8_ = uStack_790;
        auVar22._0_8_ = local_798;
        auVar47 = packssdw(auVar23,auVar22);
        local_7a8 = auVar46._0_8_;
        uStack_7a0 = auVar46._8_8_;
        local_7b8 = auVar47._0_8_;
        uStack_7b0 = auVar47._8_8_;
        local_458 = local_7a8;
        uVar35 = local_458;
        uStack_450 = uStack_7a0;
        local_468 = local_7b8;
        uVar34 = local_468;
        uStack_460 = uStack_7b0;
        local_458._0_2_ = auVar46._0_2_;
        local_458._2_2_ = auVar46._2_2_;
        local_458._4_2_ = auVar46._4_2_;
        local_458._6_2_ = auVar46._6_2_;
        local_468._0_2_ = auVar47._0_2_;
        local_468._2_2_ = auVar47._2_2_;
        local_468._4_2_ = auVar47._4_2_;
        local_468._6_2_ = auVar47._6_2_;
        local_198 = CONCAT26(local_468._2_2_,
                             CONCAT24(local_458._2_2_,CONCAT22((short)local_468,(short)local_458)));
        uStack_190 = CONCAT26(local_468._6_2_,
                              CONCAT24(local_458._6_2_,CONCAT22(local_468._4_2_,local_458._4_2_)));
        local_1a8 = local_588;
        uVar40 = local_1a8;
        uStack_1a0 = uStack_580;
        uVar41 = uStack_1a0;
        local_1a8._0_2_ = (short)local_588;
        local_1a8._2_2_ = (short)((ulong)local_588 >> 0x10);
        local_1a8._4_2_ = (short)((ulong)local_588 >> 0x20);
        local_1a8._6_2_ = (short)((ulong)local_588 >> 0x30);
        uStack_1a0._0_2_ = (short)uStack_580;
        uStack_1a0._2_2_ = (short)((ulong)uStack_580 >> 0x10);
        uStack_1a0._4_2_ = (short)((ulong)uStack_580 >> 0x20);
        uStack_1a0._6_2_ = (short)((ulong)uStack_580 >> 0x30);
        uVar44 = (ushort)((short)local_1a8 < (short)local_458) * (short)local_1a8 |
                 (ushort)((short)local_1a8 >= (short)local_458) * (short)local_458;
        uVar48 = (ushort)(local_1a8._2_2_ < (short)local_468) * local_1a8._2_2_ |
                 (ushort)(local_1a8._2_2_ >= (short)local_468) * (short)local_468;
        uVar49 = (ushort)(local_1a8._4_2_ < local_458._2_2_) * local_1a8._4_2_ |
                 (ushort)(local_1a8._4_2_ >= local_458._2_2_) * local_458._2_2_;
        uVar51 = (ushort)(local_1a8._6_2_ < local_468._2_2_) * local_1a8._6_2_ |
                 (ushort)(local_1a8._6_2_ >= local_468._2_2_) * local_468._2_2_;
        uVar52 = (ushort)((short)uStack_1a0 < local_458._4_2_) * (short)uStack_1a0 |
                 (ushort)((short)uStack_1a0 >= local_458._4_2_) * local_458._4_2_;
        uVar54 = (ushort)(uStack_1a0._2_2_ < local_468._4_2_) * uStack_1a0._2_2_ |
                 (ushort)(uStack_1a0._2_2_ >= local_468._4_2_) * local_468._4_2_;
        uVar55 = (ushort)(uStack_1a0._4_2_ < local_458._6_2_) * uStack_1a0._4_2_ |
                 (ushort)(uStack_1a0._4_2_ >= local_458._6_2_) * local_458._6_2_;
        uVar57 = (ushort)(uStack_1a0._6_2_ < local_468._6_2_) * uStack_1a0._6_2_ |
                 (ushort)(uStack_1a0._6_2_ >= local_468._6_2_) * local_468._6_2_;
        local_158 = CONCAT26(uVar51,CONCAT24(uVar49,CONCAT22(uVar48,uVar44)));
        uStack_150 = CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22(uVar54,uVar52)));
        local_168 = local_598;
        uVar42 = local_168;
        uStack_160 = uStack_590;
        uVar43 = uStack_160;
        local_168._0_2_ = (short)local_598;
        local_168._2_2_ = (short)((ulong)local_598 >> 0x10);
        local_168._4_2_ = (short)((ulong)local_598 >> 0x20);
        local_168._6_2_ = (short)((ulong)local_598 >> 0x30);
        uStack_160._0_2_ = (short)uStack_590;
        uStack_160._2_2_ = (short)((ulong)uStack_590 >> 0x10);
        uStack_160._4_2_ = (short)((ulong)uStack_590 >> 0x20);
        uStack_160._6_2_ = (short)((ulong)uStack_590 >> 0x30);
        uVar44 = (ushort)((short)uVar44 < (short)local_168) * (short)local_168 |
                 ((short)uVar44 >= (short)local_168) * uVar44;
        uVar48 = (ushort)((short)uVar48 < local_168._2_2_) * local_168._2_2_ |
                 ((short)uVar48 >= local_168._2_2_) * uVar48;
        uVar49 = (ushort)((short)uVar49 < local_168._4_2_) * local_168._4_2_ |
                 ((short)uVar49 >= local_168._4_2_) * uVar49;
        uVar51 = (ushort)((short)uVar51 < local_168._6_2_) * local_168._6_2_ |
                 ((short)uVar51 >= local_168._6_2_) * uVar51;
        uVar52 = (ushort)((short)uVar52 < (short)uStack_160) * (short)uStack_160 |
                 ((short)uVar52 >= (short)uStack_160) * uVar52;
        uVar54 = (ushort)((short)uVar54 < uStack_160._2_2_) * uStack_160._2_2_ |
                 ((short)uVar54 >= uStack_160._2_2_) * uVar54;
        uVar55 = (ushort)((short)uVar55 < uStack_160._4_2_) * uStack_160._4_2_ |
                 ((short)uVar55 >= uStack_160._4_2_) * uVar55;
        uVar57 = (ushort)((short)uVar57 < uStack_160._6_2_) * uStack_160._6_2_ |
                 ((short)uVar57 >= uStack_160._6_2_) * uVar57;
        if (local_508 - local_514 < 5) {
          if (local_508 == 4) {
            local_d0 = (undefined8 *)(local_500 + (long)(local_510 * local_504 + local_514) * 2);
            local_e8 = CONCAT26(uVar51,CONCAT24(uVar49,CONCAT22(uVar48,uVar44)));
            uStack_e0 = CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22(uVar54,uVar52)));
            *local_d0 = local_e8;
          }
          else {
            local_a8 = CONCAT26(uVar51,CONCAT24(uVar49,CONCAT22(uVar48,uVar44)));
            uStack_a0 = CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22(uVar54,uVar52)));
            *(uint *)(local_500 + (long)(local_510 * local_504 + local_514) * 2) =
                 CONCAT22(uVar48,uVar44);
            local_98 = local_a8;
            uStack_90 = uStack_a0;
          }
        }
        else {
          local_110 = (undefined8 *)(local_500 + (long)(local_510 * local_504 + local_514) * 2);
          local_128 = CONCAT26(uVar51,CONCAT24(uVar49,CONCAT22(uVar48,uVar44)));
          uStack_120 = CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22(uVar54,uVar52)));
          *local_110 = local_128;
          local_110[1] = uStack_120;
        }
        local_468 = uVar34;
        local_458 = uVar35;
        local_308 = uVar36;
        uStack_300 = uVar37;
        local_2e8 = uVar38;
        uStack_2e0 = uVar39;
        local_1a8 = uVar40;
        uStack_1a0 = uVar41;
        local_168 = uVar42;
        uStack_160 = uVar43;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const int subpel_x_qn,
                                    ConvolveParams *conv_params, int bd) {
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();

  if (filter_params_x->taps == 12) {
    __m128i s[6], coeffs_x[6];

    prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);
          const __m128i row02 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 16)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);
          s[4] = _mm_alignr_epi8(row02, row01, 0);
          s[5] = _mm_alignr_epi8(row02, row01, 4);

          __m128i res_even = convolve_12tap(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);
          s[4] = _mm_alignr_epi8(row02, row01, 2);
          s[5] = _mm_alignr_epi8(row02, row01, 6);

          __m128i res_odd = convolve_12tap(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  } else {
    __m128i s[4], coeffs_x[4];
    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);

          __m128i res_even = convolve(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);

          __m128i res_odd = convolve(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);

          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  }
}